

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O0

char * deMemPool_strnDup(deMemPool *pool,char *str,int maxLength)

{
  int iVar1;
  size_t sVar2;
  char *__dest;
  char *newStr;
  size_t len;
  int maxLength_local;
  char *str_local;
  deMemPool *pool_local;
  
  sVar2 = strlen(str);
  iVar1 = deMax32(0,maxLength);
  iVar1 = deMin32((int)sVar2,iVar1);
  sVar2 = (size_t)iVar1;
  __dest = (char *)deMemPool_alloc(pool,sVar2 + 1);
  if (__dest != (char *)0x0) {
    memcpy(__dest,str,sVar2);
    __dest[sVar2] = '\0';
  }
  return __dest;
}

Assistant:

char* deMemPool_strnDup (deMemPool* pool, const char* str, int maxLength)
{
	size_t	len			= (size_t)deMin32((int)strlen(str), deMax32(0, maxLength));
	char*	newStr		= (char*)deMemPool_alloc(pool, len + 1);

	DE_ASSERT(maxLength >= 0);

	if (newStr)
	{
		memcpy(newStr, str, len);
		newStr[len] = 0;
	}
	return newStr;
}